

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.cc
# Opt level: O2

pair<unsigned_int,_Elf64_Sym> * __thiscall
pstack::Elf::SymHash::findSymbol
          (pair<unsigned_int,_Elf64_Sym> *__return_storage_ptr__,SymHash *this,string *name)

{
  element_type *peVar1;
  uchar uVar2;
  uchar uVar3;
  Elf64_Section EVar4;
  Elf64_Addr EVar5;
  __type _Var6;
  uint uVar7;
  size_type sVar8;
  uint uVar9;
  ulong uVar10;
  string *__range2;
  undefined1 local_70 [8];
  string candidateName;
  value_type candidate;
  uint *puVar11;
  
  uVar7 = 0;
  for (sVar8 = 0; name->_M_string_length != sVar8; sVar8 = sVar8 + 1) {
    uVar7 = uVar7 * 0x10 + (int)(name->_M_dataplus)._M_p[sVar8];
    uVar9 = uVar7 & 0xf0000000;
    uVar7 = ~uVar9 & (uVar9 >> 0x18 ^ uVar7);
  }
  puVar11 = this->buckets + (ulong)uVar7 % (ulong)this->nbucket;
  while( true ) {
    uVar7 = *puVar11;
    uVar10 = (ulong)uVar7;
    if (uVar10 == 0) {
      undef();
      __return_storage_ptr__->first = 0;
      EVar5 = undef::theUndef.undefSym.st_value;
      uVar2 = undef::theUndef.undefSym.st_info;
      uVar3 = undef::theUndef.undefSym.st_other;
      EVar4 = undef::theUndef.undefSym.st_shndx;
      (__return_storage_ptr__->second).st_name = undef::theUndef.undefSym.st_name;
      (__return_storage_ptr__->second).st_info = uVar2;
      (__return_storage_ptr__->second).st_other = uVar3;
      (__return_storage_ptr__->second).st_shndx = EVar4;
      (__return_storage_ptr__->second).st_value = EVar5;
      (__return_storage_ptr__->second).st_size = undef::theUndef.undefSym.st_size;
      return __return_storage_ptr__;
    }
    Reader::readObj<Elf64_Sym>
              ((value_type *)((long)&candidateName.field_2 + 8),
               (this->syms).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,uVar10 * 0x18);
    peVar1 = (this->strings).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    (*peVar1->_vptr_Reader[7])
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,peVar1,
               (ulong)(uint)candidateName.field_2._8_4_);
    _Var6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_70,name);
    if (_Var6) break;
    std::__cxx11::string::~string((string *)local_70);
    puVar11 = this->chains + uVar10;
  }
  __return_storage_ptr__->first = uVar7;
  (__return_storage_ptr__->second).st_name = candidateName.field_2._8_4_;
  (__return_storage_ptr__->second).st_info = (char)candidateName.field_2._12_4_;
  (__return_storage_ptr__->second).st_other = (char)((uint)candidateName.field_2._12_4_ >> 8);
  (__return_storage_ptr__->second).st_shndx = (short)((uint)candidateName.field_2._12_4_ >> 0x10);
  (__return_storage_ptr__->second).st_value = candidate._0_8_;
  (__return_storage_ptr__->second).st_size = candidate.st_value;
  std::__cxx11::string::~string((string *)local_70);
  return __return_storage_ptr__;
}

Assistant:

std::pair<uint32_t, Sym>
SymHash::findSymbol(const string &name)
{
    uint32_t bucket = elf_hash(name) % nbucket;
    for (Word i = buckets[bucket]; i != STN_UNDEF; i = chains[i]) {
        auto candidate = syms->readObj<Sym>(i * sizeof (Sym));
        auto candidateName = strings->readString(candidate.st_name);
        if (candidateName == name)
            return std::make_pair(i, candidate);
    }
    return std::make_pair(0, undef());
}